

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int memory_read_publickey
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,char *pubkeyfiledata,size_t pubkeyfiledata_len)

{
  int iVar1;
  uchar *__dest;
  ushort **ppuVar2;
  void *pvVar3;
  uchar *puVar4;
  char *pcVar5;
  long lVar6;
  uchar *puVar7;
  size_t tmp_len;
  uchar *tmp;
  size_t local_40;
  uchar *local_38;
  
  if (pubkeyfiledata_len < 2) {
    pcVar5 = "Invalid data in public key file";
  }
  else {
    __dest = (uchar *)(*session->alloc)(pubkeyfiledata_len,&session->abstract);
    if (__dest == (uchar *)0x0) {
      pcVar5 = "Unable to allocate memory for public key data";
      iVar1 = -6;
      goto LAB_001174fe;
    }
    memcpy(__dest,pubkeyfiledata,pubkeyfiledata_len);
    ppuVar2 = __ctype_b_loc();
    lVar6 = -pubkeyfiledata_len;
    do {
      pubkeyfiledata_len = pubkeyfiledata_len - 1;
      if ((*(byte *)((long)*ppuVar2 + (ulong)__dest[pubkeyfiledata_len] * 2 + 1) & 0x20) == 0) {
        pvVar3 = memchr(__dest,0x20,-lVar6);
        if (pvVar3 != (void *)0x0) {
          pcVar5 = (char *)((long)pvVar3 + 1);
          puVar4 = (uchar *)memchr(pcVar5,0x20,(size_t)(__dest + (~(ulong)pvVar3 - lVar6)));
          puVar7 = __dest + -lVar6;
          if (puVar4 != (uchar *)0x0) {
            puVar7 = puVar4;
          }
          iVar1 = _libssh2_base64_decode
                            (session,(char **)&local_38,&local_40,pcVar5,(long)puVar7 - (long)pcVar5
                            );
          if (iVar1 == 0) {
            *method = __dest;
            *method_len = (size_t)(pcVar5 + (-1 - (long)__dest));
            *pubkeydata = local_38;
            *pubkeydata_len = local_40;
            iVar1 = 0;
          }
          else {
            (*session->free)(__dest,&session->abstract);
            iVar1 = _libssh2_error(session,-0x10,"Invalid key data, not base64 encoded");
          }
          return iVar1;
        }
        (*session->free)(__dest,&session->abstract);
        pcVar5 = "Invalid public key data";
        goto LAB_001174f6;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
    (*session->free)(__dest,&session->abstract);
    pcVar5 = "Missing public key data";
  }
LAB_001174f6:
  iVar1 = -0x10;
LAB_001174fe:
  iVar1 = _libssh2_error(session,iVar1,pcVar5);
  return iVar1;
}

Assistant:

static int
memory_read_publickey(LIBSSH2_SESSION * session, unsigned char **method,
                      size_t *method_len,
                      unsigned char **pubkeydata,
                      size_t *pubkeydata_len,
                      const char *pubkeyfiledata,
                      size_t pubkeyfiledata_len)
{
    unsigned char *pubkey = NULL, *sp1, *sp2, *tmp;
    size_t pubkey_len = pubkeyfiledata_len;
    size_t tmp_len;

    if(pubkeyfiledata_len <= 1) {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid data in public key file");
    }

    pubkey = LIBSSH2_ALLOC(session, pubkeyfiledata_len);
    if(!pubkey) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for public key data");
    }

    memcpy(pubkey, pubkeyfiledata, pubkeyfiledata_len);

    /*
     *   Remove trailing whitespace
     */
    while(pubkey_len && isspace(pubkey[pubkey_len - 1]))
        pubkey_len--;

    if(!pubkey_len) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Missing public key data");
    }

    sp1 = memchr(pubkey, ' ', pubkey_len);
    if(!sp1) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid public key data");
    }

    sp1++;

    sp2 = memchr(sp1, ' ', pubkey_len - (sp1 - pubkey));
    if(!sp2) {
        /* Assume that the id string is missing, but that it's okay */
        sp2 = pubkey + pubkey_len;
    }

    if(_libssh2_base64_decode(session, (char **)&tmp, &tmp_len,
                              (const char *)sp1,
                              sp2 - sp1)) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid key data, not base64 encoded");
    }

    /* Wasting some bytes here (okay, more than some), but since it's likely
     * to be freed soon anyway, we'll just avoid the extra free/alloc and call
     * it a wash
     */
    *method = pubkey;
    *method_len = sp1 - pubkey - 1;

    *pubkeydata = tmp;
    *pubkeydata_len = tmp_len;

    return 0;
}